

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

unsigned_short process_metadata(fb_parser_t *P,fb_metadata_t *m,uint16_t expect,fb_metadata_t **out)

{
  uint uVar1;
  fb_name_t *pfVar2;
  ulong uVar3;
  char *msg;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  out[0xc] = (fb_metadata_t *)0x0;
  out[0xd] = (fb_metadata_t *)0x0;
  out[10] = (fb_metadata_t *)0x0;
  out[0xb] = (fb_metadata_t *)0x0;
  out[8] = (fb_metadata_t *)0x0;
  out[9] = (fb_metadata_t *)0x0;
  out[6] = (fb_metadata_t *)0x0;
  out[7] = (fb_metadata_t *)0x0;
  out[4] = (fb_metadata_t *)0x0;
  out[5] = (fb_metadata_t *)0x0;
  out[2] = (fb_metadata_t *)0x0;
  out[3] = (fb_metadata_t *)0x0;
  *out = (fb_metadata_t *)0x0;
  out[1] = (fb_metadata_t *)0x0;
  if (m == (fb_metadata_t *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    iVar6 = -99;
    do {
      pfVar2 = fb_name_table_find(&((P->schema).root_schema)->attribute_index,m->ident->text,
                                  m->ident->len);
      if (pfVar2 == (fb_name_t *)0x0) {
        msg = "unknown attribute not declared";
        goto LAB_001231f9;
      }
      uVar1 = *(uint *)&pfVar2[1].link;
      uVar3 = (ulong)uVar1;
      if (uVar3 == 0) goto switchD_00123258_caseD_2;
      if ((expect >> (uVar1 & 0x1f) & 1) == 0) {
        msg = "known attribute not expected in this context";
LAB_001231f9:
        __flatcc_error_report(P,m->ident,msg,(fb_token_t *)0x0,(char *)0x0,0);
      }
      else {
        uVar5 = uVar5 | 1 << ((byte)uVar1 & 0x1f);
        if (out[uVar3] != (fb_metadata_t *)0x0) {
          msg = "known attribute listed multiple times";
          goto LAB_001231f9;
        }
        out[uVar3] = m;
        if (((0x3dacUL >> (uVar3 & 0x3f) & 1) != 0) && ((m->value).type != 0)) {
          msg = "known attribute does not expect a value";
          goto LAB_001231f9;
        }
        switch(uVar1) {
        case 1:
        case 4:
          msg = "known attribute expects an unsigned integer";
          if ((m->value).type != 6) goto LAB_001231f9;
          break;
        case 6:
        case 9:
          msg = "known attribute expects a string";
          if ((m->value).type != 3) goto LAB_001231f9;
        }
      }
switchD_00123258_caseD_2:
      uVar4 = (unsigned_short)uVar5;
      m = m->link;
    } while ((m != (fb_metadata_t *)0x0) && (bVar7 = iVar6 != 0, iVar6 = iVar6 + 1, bVar7));
    if (m != (fb_metadata_t *)0x0) {
      __flatcc_error_report(P,m->ident,"too many attributes",(fb_token_t *)0x0,(char *)0x0,0);
    }
  }
  return uVar4;
}

Assistant:

static inline unsigned short process_metadata(fb_parser_t *P, fb_metadata_t *m,
        uint16_t expect, fb_metadata_t *out[KNOWN_ATTR_COUNT])
{
    uint16_t flags;
    unsigned int i, n = FLATCC_ATTR_MAX;
    int type;
    fb_attribute_t *a;

    memset(out, 0, sizeof(out[0]) * KNOWN_ATTR_COUNT);
    for (flags = 0; m && n; --n, m = m->link) {
        a = (fb_attribute_t *)find_fb_name_by_token(&P->schema.root_schema->attribute_index, m->ident);
        if (!a) {
            error_tok(P, m->ident, "unknown attribute not declared");
            continue;
        }
        if (!(i = a->known)) {
            continue;
        }
        if (!((1 << i) & expect)) {
            error_tok(P, m->ident, "known attribute not expected in this context");
            continue;
        }
        flags |= 1 << i;
        if (out[i]) {
            error_tok(P, m->ident, "known attribute listed multiple times");
            continue;
        }
        out[i] = m;
        type = fb_known_attribute_types[i];
        if (type == vt_missing && m->value.type != vt_missing) {
            error_tok(P, m->ident, "known attribute does not expect a value");
            continue;
        }
        if (type == vt_string && m->value.type != vt_string) {
            error_tok(P, m->ident, "known attribute expects a string");
            continue;
        }
        if (type == vt_uint && m->value.type != vt_uint) {
            error_tok(P, m->ident, "known attribute expects an unsigned integer");
            continue;
        }
        if (type == vt_int && m->value.type != vt_uint && m->value.type != vt_int) {
            error_tok(P, m->ident, "known attribute expects an integer");
            continue;
        }
        if (type == vt_bool && m->value.type != vt_bool) {
            error_tok(P, m->ident, "known attribute expects 'true' or 'false'");
            continue;
        }
    }
    if (m) {
        error_tok(P, m->ident, "too many attributes");
    }
    return flags;
}